

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

void google::protobuf::compiler::ruby::GenerateField(FieldDescriptor *field,Printer *printer)

{
  FieldDescriptor *pFVar1;
  bool bVar2;
  int iVar3;
  CppType CVar4;
  string *psVar5;
  Descriptor *pDVar6;
  EnumDescriptor *pEVar7;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *field_03;
  FieldDescriptor *field_04;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_68;
  string local_48;
  FieldDescriptor *local_28;
  FieldDescriptor *value_field;
  FieldDescriptor *key_field;
  Printer *printer_local;
  FieldDescriptor *field_local;
  
  key_field = (FieldDescriptor *)printer;
  printer_local = (Printer *)field;
  bVar2 = FieldDescriptor::is_map(field);
  pFVar1 = key_field;
  if (bVar2) {
    pDVar6 = FieldDescriptor::message_type((FieldDescriptor *)printer_local);
    value_field = Descriptor::FindFieldByNumber(pDVar6,1);
    pDVar6 = FieldDescriptor::message_type((FieldDescriptor *)printer_local);
    local_28 = Descriptor::FindFieldByNumber(pDVar6,2);
    pFVar1 = key_field;
    psVar5 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)printer_local);
    TypeName_abi_cxx11_(&local_48,(ruby *)value_field,field_01);
    TypeName_abi_cxx11_(&local_68,(ruby *)local_28,field_02);
    iVar3 = FieldDescriptor::number((FieldDescriptor *)printer_local);
    NumberToString<int>(&local_98,iVar3);
    io::Printer::
    Print<char[5],std::__cxx11::string,char[9],std::__cxx11::string,char[11],std::__cxx11::string,char[7],std::__cxx11::string>
              ((Printer *)pFVar1,"map :$name$, :$key_type$, :$value_type$, $number$",
               (char (*) [5])0x77db8d,psVar5,(char (*) [9])0x7acdc7,&local_48,
               (char (*) [11])0x7aceb8,&local_68,(char (*) [7])0x79279d,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    CVar4 = FieldDescriptor::cpp_type(local_28);
    pFVar1 = key_field;
    if (CVar4 == CPPTYPE_MESSAGE) {
      pDVar6 = FieldDescriptor::message_type(local_28);
      psVar5 = Descriptor::full_name_abi_cxx11_(pDVar6);
      io::Printer::Print<char[8],std::__cxx11::string>
                ((Printer *)pFVar1,", \"$subtype$\"\n",(char (*) [8])"subtype",psVar5);
    }
    else {
      CVar4 = FieldDescriptor::cpp_type(local_28);
      pFVar1 = key_field;
      if (CVar4 == CPPTYPE_ENUM) {
        pEVar7 = FieldDescriptor::enum_type(local_28);
        psVar5 = EnumDescriptor::full_name_abi_cxx11_(pEVar7);
        io::Printer::Print<char[8],std::__cxx11::string>
                  ((Printer *)pFVar1,", \"$subtype$\"\n",(char (*) [8])"subtype",psVar5);
      }
      else {
        io::Printer::Print<>((Printer *)key_field,"\n");
      }
    }
  }
  else {
    LabelForField_abi_cxx11_(&local_b8,(ruby *)printer_local,field_00);
    psVar5 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)printer_local);
    io::Printer::Print<char[6],std::__cxx11::string,char[5],std::__cxx11::string>
              ((Printer *)pFVar1,"$label$ :$name$, ",(char (*) [6])"label",&local_b8,
               (char (*) [5])0x77db8d,psVar5);
    std::__cxx11::string::~string((string *)&local_b8);
    pFVar1 = key_field;
    TypeName_abi_cxx11_(&local_d8,(ruby *)printer_local,field_03);
    iVar3 = FieldDescriptor::number((FieldDescriptor *)printer_local);
    NumberToString<int>(&local_f8,iVar3);
    io::Printer::Print<char[5],std::__cxx11::string,char[7],std::__cxx11::string>
              ((Printer *)pFVar1,":$type$, $number$",(char (*) [5])0x7cd92b,&local_d8,
               (char (*) [7])0x79279d,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)printer_local);
    pFVar1 = key_field;
    if (CVar4 == CPPTYPE_MESSAGE) {
      pDVar6 = FieldDescriptor::message_type((FieldDescriptor *)printer_local);
      psVar5 = Descriptor::full_name_abi_cxx11_(pDVar6);
      io::Printer::Print<char[8],std::__cxx11::string>
                ((Printer *)pFVar1,", \"$subtype$\"",(char (*) [8])"subtype",psVar5);
    }
    else {
      CVar4 = FieldDescriptor::cpp_type((FieldDescriptor *)printer_local);
      pFVar1 = key_field;
      if (CVar4 == CPPTYPE_ENUM) {
        pEVar7 = FieldDescriptor::enum_type((FieldDescriptor *)printer_local);
        psVar5 = EnumDescriptor::full_name_abi_cxx11_(pEVar7);
        io::Printer::Print<char[8],std::__cxx11::string>
                  ((Printer *)pFVar1,", \"$subtype$\"",(char (*) [8])"subtype",psVar5);
      }
    }
    bVar2 = FieldDescriptor::has_default_value((FieldDescriptor *)printer_local);
    pFVar1 = key_field;
    if (bVar2) {
      DefaultValueForField_abi_cxx11_(&local_118,(ruby *)printer_local,field_04);
      io::Printer::Print<char[8],std::__cxx11::string>
                ((Printer *)pFVar1,", default: $default$",(char (*) [8])0x7735f3,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
    }
    bVar2 = FieldDescriptor::has_json_name((FieldDescriptor *)printer_local);
    pFVar1 = key_field;
    if (bVar2) {
      psVar5 = FieldDescriptor::json_name_abi_cxx11_((FieldDescriptor *)printer_local);
      io::Printer::Print<char[10],std::__cxx11::string>
                ((Printer *)pFVar1,", json_name: \"$json_name$\"",(char (*) [10])0x7cbd6e,psVar5);
    }
    io::Printer::Print<>((Printer *)key_field,"\n");
  }
  return;
}

Assistant:

void GenerateField(const FieldDescriptor* field, io::Printer* printer) {
  if (field->is_map()) {
    const FieldDescriptor* key_field =
        field->message_type()->FindFieldByNumber(1);
    const FieldDescriptor* value_field =
        field->message_type()->FindFieldByNumber(2);

    printer->Print(
      "map :$name$, :$key_type$, :$value_type$, $number$",
      "name", field->name(),
      "key_type", TypeName(key_field),
      "value_type", TypeName(value_field),
      "number", NumberToString(field->number()));

    if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
        ", \"$subtype$\"\n",
        "subtype", value_field->message_type()->full_name());
    } else if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
        ", \"$subtype$\"\n",
        "subtype", value_field->enum_type()->full_name());
    } else {
      printer->Print("\n");
    }
  } else {

    printer->Print(
      "$label$ :$name$, ",
      "label", LabelForField(field),
      "name", field->name());
    printer->Print(
      ":$type$, $number$",
      "type", TypeName(field),
      "number", NumberToString(field->number()));

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
        ", \"$subtype$\"",
       "subtype", field->message_type()->full_name());
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      printer->Print(
        ", \"$subtype$\"",
        "subtype", field->enum_type()->full_name());
    }

    if (field->has_default_value()) {
      printer->Print(", default: $default$", "default",
                     DefaultValueForField(field));
    }

    if (field->has_json_name()) {
      printer->Print(", json_name: \"$json_name$\"", "json_name",
                    field->json_name());
    }

    printer->Print("\n");
  }
}